

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O0

Location *
psy::Location::create(Location *__return_storage_ptr__,FileLinePositionSpan *fileLineSpan)

{
  FileLinePositionSpan local_48;
  FileLinePositionSpan *local_18;
  FileLinePositionSpan *fileLineSpan_local;
  
  local_18 = fileLineSpan;
  fileLineSpan_local = &__return_storage_ptr__->fileLineSpan_;
  FileLinePositionSpan::FileLinePositionSpan(&local_48,fileLineSpan);
  Location(__return_storage_ptr__,&local_48);
  FileLinePositionSpan::~FileLinePositionSpan(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Location Location::create(FileLinePositionSpan fileLineSpan)
{
    return Location(std::move(fileLineSpan));
}